

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void * HUF_alignUpWorkspace(void *workspace,size_t *workspaceSizePtr,size_t align)

{
  ulong uVar1;
  ulong uVar2;
  ulong in_RDX;
  ulong *in_RSI;
  ulong in_RDI;
  BYTE *aligned;
  size_t add;
  size_t rem;
  size_t mask;
  void *local_8;
  
  uVar1 = in_RDX - 1;
  uVar2 = in_RDX - (in_RDI & uVar1) & uVar1;
  local_8 = (void *)(in_RDI + uVar2);
  if ((in_RDX & in_RDX - 1) != 0) {
    __assert_fail("(align & (align - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3b52,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
  }
  if (8 < in_RDX) {
    __assert_fail("align <= HUF_WORKSPACE_MAX_ALIGNMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3b53,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
  }
  if (*in_RSI < uVar2) {
    *in_RSI = 0;
    local_8 = (void *)0x0;
  }
  else {
    if (in_RDX <= uVar2) {
      __assert_fail("add < align",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3b55,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
    }
    if (((ulong)local_8 & uVar1) != 0) {
      __assert_fail("((size_t)aligned & mask) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3b56,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
    }
    *in_RSI = *in_RSI - uVar2;
  }
  return local_8;
}

Assistant:

static void* HUF_alignUpWorkspace(void* workspace, size_t* workspaceSizePtr, size_t align)
{
    size_t const mask = align - 1;
    size_t const rem = (size_t)workspace & mask;
    size_t const add = (align - rem) & mask;
    BYTE* const aligned = (BYTE*)workspace + add;
    assert((align & (align - 1)) == 0); /* pow 2 */
    assert(align <= HUF_WORKSPACE_MAX_ALIGNMENT);
    if (*workspaceSizePtr >= add) {
        assert(add < align);
        assert(((size_t)aligned & mask) == 0);
        *workspaceSizePtr -= add;
        return aligned;
    } else {
        *workspaceSizePtr = 0;
        return NULL;
    }
}